

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void DrawTextureNPatch(Texture2D texture,NPatchInfo nPatchInfo,Rectangle dest,Vector2 origin,
                      float rotation,Color tint)

{
  bool bVar1;
  bool bVar2;
  NPatchInfo NVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float y;
  float x;
  float y_00;
  float x_00;
  float y_01;
  float x_01;
  float y_02;
  float local_a8;
  float local_a4;
  Vector2 coordD;
  Vector2 coordC;
  Vector2 coordB;
  Vector2 coordA;
  Vector2 vertD;
  Vector2 vertC;
  Vector2 vertB;
  Vector2 vertA;
  float bottomBorder;
  float rightBorder;
  float topBorder;
  float leftBorder;
  _Bool drawMiddle;
  float fStack_34;
  _Bool drawCenter;
  float patchHeight;
  float patchWidth;
  float height;
  float width;
  float rotation_local;
  Color tint_local;
  Vector2 origin_local;
  Rectangle dest_local;
  
  if (texture.id != 0) {
    fVar4 = (float)texture.width;
    fVar5 = (float)texture.height;
    dest_local.x = dest.width;
    if (0.0 < dest_local.x) {
      local_a4 = dest_local.x;
    }
    else {
      local_a4 = 0.0;
    }
    fStack_34 = local_a4;
    dest_local.y = dest.height;
    if (0.0 < dest_local.y) {
      local_a8 = dest_local.y;
    }
    else {
      local_a8 = 0.0;
    }
    leftBorder = local_a8;
    if (nPatchInfo.source.width < 0.0) {
      nPatchInfo.source.x = nPatchInfo.source.x - nPatchInfo.source.width;
    }
    NVar3 = nPatchInfo;
    if (nPatchInfo.source.height < 0.0) {
      fVar6 = nPatchInfo.source.y - nPatchInfo.source.height;
      nPatchInfo.source.y = fVar6;
    }
    if (nPatchInfo.layout == 2) {
      leftBorder = nPatchInfo.source.height;
    }
    if (nPatchInfo.layout == 1) {
      fStack_34 = nPatchInfo.source.width;
    }
    bVar1 = true;
    bVar2 = true;
    rightBorder = (float)nPatchInfo.left;
    bottomBorder = (float)nPatchInfo.top;
    vertA.y = (float)nPatchInfo.right;
    vertA.x = (float)nPatchInfo.bottom;
    if ((fStack_34 <= rightBorder + vertA.y) && (nPatchInfo.layout != 1)) {
      bVar1 = false;
      rightBorder = (rightBorder / (rightBorder + vertA.y)) * fStack_34;
      vertA.y = fStack_34 - rightBorder;
    }
    if ((leftBorder <= bottomBorder + vertA.x) && (nPatchInfo.layout != 2)) {
      bVar2 = false;
      bottomBorder = (bottomBorder / (bottomBorder + vertA.x)) * leftBorder;
      vertA.x = leftBorder - bottomBorder;
    }
    fVar6 = fStack_34 - vertA.y;
    y = leftBorder - vertA.x;
    x = nPatchInfo.source.x / fVar4;
    y_00 = nPatchInfo.source.y / fVar5;
    x_00 = (nPatchInfo.source.x + rightBorder) / fVar4;
    y_01 = (nPatchInfo.source.y + bottomBorder) / fVar5;
    x_01 = ((nPatchInfo.source.x + nPatchInfo.source.width) - vertA.y) / fVar4;
    y_02 = ((nPatchInfo.source.y + nPatchInfo.source.height) - vertA.x) / fVar5;
    fVar4 = (nPatchInfo.source.x + nPatchInfo.source.width) / fVar4;
    fVar5 = (nPatchInfo.source.y + nPatchInfo.source.height) / fVar5;
    rlSetTexture(texture.id);
    rlPushMatrix();
    origin_local.x = dest.x;
    origin_local.y = dest.y;
    rlTranslatef(origin_local.x,origin_local.y,0.0);
    rlRotatef(rotation,0.0,0.0,1.0);
    rotation_local = origin.x;
    tint_local = (Color)origin.y;
    rlTranslatef(-rotation_local,-(float)tint_local,0.0);
    rlBegin(7);
    width._0_1_ = tint.r;
    width._1_1_ = tint.g;
    width._2_1_ = tint.b;
    width._3_1_ = tint.a;
    rlColor4ub(width._0_1_,width._1_1_,width._2_1_,width._3_1_);
    rlNormal3f(0.0,0.0,1.0);
    nPatchInfo.layout = NVar3.layout;
    if (nPatchInfo.layout == 0) {
      rlTexCoord2f(x,y_01);
      rlVertex2f(0.0,bottomBorder);
      rlTexCoord2f(x_00,y_01);
      rlVertex2f(rightBorder,bottomBorder);
      rlTexCoord2f(x_00,y_00);
      rlVertex2f(rightBorder,0.0);
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,0.0);
      if (bVar1) {
        rlTexCoord2f(x_00,y_01);
        rlVertex2f(rightBorder,bottomBorder);
        rlTexCoord2f(x_01,y_01);
        rlVertex2f(fVar6,bottomBorder);
        rlTexCoord2f(x_01,y_00);
        rlVertex2f(fVar6,0.0);
        rlTexCoord2f(x_00,y_00);
        rlVertex2f(rightBorder,0.0);
      }
      rlTexCoord2f(x_01,y_01);
      rlVertex2f(fVar6,bottomBorder);
      rlTexCoord2f(fVar4,y_01);
      rlVertex2f(fStack_34,bottomBorder);
      rlTexCoord2f(fVar4,y_00);
      rlVertex2f(fStack_34,0.0);
      rlTexCoord2f(x_01,y_00);
      rlVertex2f(fVar6,0.0);
      if (bVar2) {
        rlTexCoord2f(x,y_02);
        rlVertex2f(0.0,y);
        rlTexCoord2f(x_00,y_02);
        rlVertex2f(rightBorder,y);
        rlTexCoord2f(x_00,y_01);
        rlVertex2f(rightBorder,bottomBorder);
        rlTexCoord2f(x,y_01);
        rlVertex2f(0.0,bottomBorder);
        if (bVar1) {
          rlTexCoord2f(x_00,y_02);
          rlVertex2f(rightBorder,y);
          rlTexCoord2f(x_01,y_02);
          rlVertex2f(fVar6,y);
          rlTexCoord2f(x_01,y_01);
          rlVertex2f(fVar6,bottomBorder);
          rlTexCoord2f(x_00,y_01);
          rlVertex2f(rightBorder,bottomBorder);
        }
        rlTexCoord2f(x_01,y_02);
        rlVertex2f(fVar6,y);
        rlTexCoord2f(fVar4,y_02);
        rlVertex2f(fStack_34,y);
        rlTexCoord2f(fVar4,y_01);
        rlVertex2f(fStack_34,bottomBorder);
        rlTexCoord2f(x_01,y_01);
        rlVertex2f(fVar6,bottomBorder);
      }
      rlTexCoord2f(x,fVar5);
      rlVertex2f(0.0,leftBorder);
      rlTexCoord2f(x_00,fVar5);
      rlVertex2f(rightBorder,leftBorder);
      rlTexCoord2f(x_00,y_02);
      rlVertex2f(rightBorder,y);
      rlTexCoord2f(x,y_02);
      rlVertex2f(0.0,y);
      if (bVar1) {
        rlTexCoord2f(x_00,fVar5);
        rlVertex2f(rightBorder,leftBorder);
        rlTexCoord2f(x_01,fVar5);
        rlVertex2f(fVar6,leftBorder);
        rlTexCoord2f(x_01,y_02);
        rlVertex2f(fVar6,y);
        rlTexCoord2f(x_00,y_02);
        rlVertex2f(rightBorder,y);
      }
      rlTexCoord2f(x_01,fVar5);
      rlVertex2f(fVar6,leftBorder);
      rlTexCoord2f(fVar4,fVar5);
      rlVertex2f(fStack_34,leftBorder);
      rlTexCoord2f(fVar4,y_02);
      rlVertex2f(fStack_34,y);
      rlTexCoord2f(x_01,y_02);
      rlVertex2f(fVar6,y);
    }
    else if (nPatchInfo.layout == 1) {
      rlTexCoord2f(x,y_01);
      rlVertex2f(0.0,bottomBorder);
      rlTexCoord2f(fVar4,y_01);
      rlVertex2f(fStack_34,bottomBorder);
      rlTexCoord2f(fVar4,y_00);
      rlVertex2f(fStack_34,0.0);
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,0.0);
      if (bVar1) {
        rlTexCoord2f(x,y_02);
        rlVertex2f(0.0,y);
        rlTexCoord2f(fVar4,y_02);
        rlVertex2f(fStack_34,y);
        rlTexCoord2f(fVar4,y_01);
        rlVertex2f(fStack_34,bottomBorder);
        rlTexCoord2f(x,y_01);
        rlVertex2f(0.0,bottomBorder);
      }
      rlTexCoord2f(x,fVar5);
      rlVertex2f(0.0,leftBorder);
      rlTexCoord2f(fVar4,fVar5);
      rlVertex2f(fStack_34,leftBorder);
      rlTexCoord2f(fVar4,y_02);
      rlVertex2f(fStack_34,y);
      rlTexCoord2f(x,y_02);
      rlVertex2f(0.0,y);
    }
    else if (nPatchInfo.layout == 2) {
      rlTexCoord2f(x,fVar5);
      rlVertex2f(0.0,leftBorder);
      rlTexCoord2f(x_00,fVar5);
      rlVertex2f(rightBorder,leftBorder);
      rlTexCoord2f(x_00,y_00);
      rlVertex2f(rightBorder,0.0);
      rlTexCoord2f(x,y_00);
      rlVertex2f(0.0,0.0);
      if (bVar1) {
        rlTexCoord2f(x_00,fVar5);
        rlVertex2f(rightBorder,leftBorder);
        rlTexCoord2f(x_01,fVar5);
        rlVertex2f(fVar6,leftBorder);
        rlTexCoord2f(x_01,y_00);
        rlVertex2f(fVar6,0.0);
        rlTexCoord2f(x_00,y_00);
        rlVertex2f(rightBorder,0.0);
      }
      rlTexCoord2f(x_01,fVar5);
      rlVertex2f(fVar6,leftBorder);
      rlTexCoord2f(fVar4,fVar5);
      rlVertex2f(fStack_34,leftBorder);
      rlTexCoord2f(fVar4,y_00);
      rlVertex2f(fStack_34,0.0);
      rlTexCoord2f(x_01,y_00);
      rlVertex2f(fVar6,0.0);
    }
    rlEnd();
    rlPopMatrix();
    rlSetTexture(0);
  }
  return;
}

Assistant:

void DrawTextureNPatch(Texture2D texture, NPatchInfo nPatchInfo, Rectangle dest, Vector2 origin, float rotation, Color tint)
{
    if (texture.id > 0)
    {
        float width = (float)texture.width;
        float height = (float)texture.height;

        float patchWidth = (dest.width <= 0.0f)? 0.0f : dest.width;
        float patchHeight = (dest.height <= 0.0f)? 0.0f : dest.height;

        if (nPatchInfo.source.width < 0) nPatchInfo.source.x -= nPatchInfo.source.width;
        if (nPatchInfo.source.height < 0) nPatchInfo.source.y -= nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL) patchHeight = nPatchInfo.source.height;
        if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL) patchWidth = nPatchInfo.source.width;

        bool drawCenter = true;
        bool drawMiddle = true;
        float leftBorder = (float)nPatchInfo.left;
        float topBorder = (float)nPatchInfo.top;
        float rightBorder = (float)nPatchInfo.right;
        float bottomBorder = (float)nPatchInfo.bottom;

        // adjust the lateral (left and right) border widths in case patchWidth < texture.width
        if (patchWidth <= (leftBorder + rightBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_VERTICAL)
        {
            drawCenter = false;
            leftBorder = (leftBorder/(leftBorder + rightBorder))*patchWidth;
            rightBorder = patchWidth - leftBorder;
        }
        // adjust the lateral (top and bottom) border heights in case patchHeight < texture.height
        if (patchHeight <= (topBorder + bottomBorder) && nPatchInfo.layout != NPATCH_THREE_PATCH_HORIZONTAL)
        {
            drawMiddle = false;
            topBorder = (topBorder/(topBorder + bottomBorder))*patchHeight;
            bottomBorder = patchHeight - topBorder;
        }

        Vector2 vertA, vertB, vertC, vertD;
        vertA.x = 0.0f;                             // outer left
        vertA.y = 0.0f;                             // outer top
        vertB.x = leftBorder;                       // inner left
        vertB.y = topBorder;                        // inner top
        vertC.x = patchWidth  - rightBorder;        // inner right
        vertC.y = patchHeight - bottomBorder;       // inner bottom
        vertD.x = patchWidth;                       // outer right
        vertD.y = patchHeight;                      // outer bottom

        Vector2 coordA, coordB, coordC, coordD;
        coordA.x = nPatchInfo.source.x/width;
        coordA.y = nPatchInfo.source.y/height;
        coordB.x = (nPatchInfo.source.x + leftBorder)/width;
        coordB.y = (nPatchInfo.source.y + topBorder)/height;
        coordC.x = (nPatchInfo.source.x + nPatchInfo.source.width  - rightBorder)/width;
        coordC.y = (nPatchInfo.source.y + nPatchInfo.source.height - bottomBorder)/height;
        coordD.x = (nPatchInfo.source.x + nPatchInfo.source.width)/width;
        coordD.y = (nPatchInfo.source.y + nPatchInfo.source.height)/height;

        rlSetTexture(texture.id);

        rlPushMatrix();
            rlTranslatef(dest.x, dest.y, 0.0f);
            rlRotatef(rotation, 0.0f, 0.0f, 1.0f);
            rlTranslatef(-origin.x, -origin.y, 0.0f);

            rlBegin(RL_QUADS);
                rlColor4ub(tint.r, tint.g, tint.b, tint.a);
                rlNormal3f(0.0f, 0.0f, 1.0f);               // Normal vector pointing towards viewer

                if (nPatchInfo.layout == NPATCH_NINE_PATCH)
                {
                    // ------------------------------------------------------------
                    // TOP-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // TOP-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // TOP-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawMiddle)
                    {
                        // ------------------------------------------------------------
                        // MIDDLE-LEFT QUAD
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                        if (drawCenter)
                        {
                            // MIDDLE-CENTER QUAD
                            rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Bottom-left corner for texture and quad
                            rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-right corner for texture and quad
                            rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-right corner for texture and quad
                            rlTexCoord2f(coordB.x, coordB.y); rlVertex2f(vertB.x, vertB.y);  // Top-left corner for texture and quad
                        }

                        // MIDDLE-RIGHT QUAD
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordB.y); rlVertex2f(vertC.x, vertB.y);  // Top-left corner for texture and quad
                    }

                    // ------------------------------------------------------------
                    // BOTTOM-LEFT QUAD
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // BOTTOM-CENTER QUAD
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordC.y); rlVertex2f(vertB.x, vertC.y);  // Top-left corner for texture and quad
                    }

                    // BOTTOM-RIGHT QUAD
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordC.y); rlVertex2f(vertC.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_VERTICAL)
                {
                    // TOP QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // MIDDLE QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordD.x, coordB.y); rlVertex2f(vertD.x, vertB.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordA.x, coordB.y); rlVertex2f(vertA.x, vertB.y);  // Top-left corner for texture and quad
                    }
                    // BOTTOM QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordC.y); rlVertex2f(vertD.x, vertC.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordC.y); rlVertex2f(vertA.x, vertC.y);  // Top-left corner for texture and quad
                }
                else if (nPatchInfo.layout == NPATCH_THREE_PATCH_HORIZONTAL)
                {
                    // LEFT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordA.x, coordD.y); rlVertex2f(vertA.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordA.x, coordA.y); rlVertex2f(vertA.x, vertA.y);  // Top-left corner for texture and quad
                    if (drawCenter)
                    {
                        // CENTER QUAD
                        // -----------------------------------------------------------
                        // Texture coords                 Vertices
                        rlTexCoord2f(coordB.x, coordD.y); rlVertex2f(vertB.x, vertD.y);  // Bottom-left corner for texture and quad
                        rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-right corner for texture and quad
                        rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-right corner for texture and quad
                        rlTexCoord2f(coordB.x, coordA.y); rlVertex2f(vertB.x, vertA.y);  // Top-left corner for texture and quad
                    }
                    // RIGHT QUAD
                    // -----------------------------------------------------------
                    // Texture coords                 Vertices
                    rlTexCoord2f(coordC.x, coordD.y); rlVertex2f(vertC.x, vertD.y);  // Bottom-left corner for texture and quad
                    rlTexCoord2f(coordD.x, coordD.y); rlVertex2f(vertD.x, vertD.y);  // Bottom-right corner for texture and quad
                    rlTexCoord2f(coordD.x, coordA.y); rlVertex2f(vertD.x, vertA.y);  // Top-right corner for texture and quad
                    rlTexCoord2f(coordC.x, coordA.y); rlVertex2f(vertC.x, vertA.y);  // Top-left corner for texture and quad
                }
            rlEnd();
        rlPopMatrix();

        rlSetTexture(0);
    }
}